

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlkf.cpp
# Opt level: O2

void __thiscall
icu_63::LocaleKeyFactory::updateVisibleIDs
          (LocaleKeyFactory *this,Hashtable *result,UErrorCode *status)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  UHashElement *pUVar3;
  int32_t pos;
  int32_t local_34;
  
  iVar2 = (*(this->super_ICUServiceFactory).super_UObject._vptr_UObject[8])(this,status);
  if ((Hashtable *)CONCAT44(extraout_var,iVar2) != (Hashtable *)0x0) {
    uVar1 = this->_coverage;
    do {
      while( true ) {
        pUVar3 = Hashtable::nextElement((Hashtable *)CONCAT44(extraout_var,iVar2),&local_34);
        if (pUVar3 == (UHashElement *)0x0) {
          return;
        }
        if ((uVar1 & 1) == 0) break;
        Hashtable::remove(result,(char *)(pUVar3->key).pointer);
      }
      Hashtable::put(result,(UnicodeString *)(pUVar3->key).pointer,this,status);
    } while (*status < U_ILLEGAL_ARGUMENT_ERROR);
  }
  return;
}

Assistant:

void
LocaleKeyFactory::updateVisibleIDs(Hashtable& result, UErrorCode& status) const {
    const Hashtable* supported = getSupportedIDs(status);
    if (supported) {
        UBool visible = (_coverage & 0x1) == 0;
        const UHashElement* elem = NULL;
        int32_t pos = UHASH_FIRST;
        while ((elem = supported->nextElement(pos)) != NULL) {
            const UnicodeString& id = *((const UnicodeString*)elem->key.pointer);
            if (!visible) {
                result.remove(id);
            } else {
                result.put(id, (void*)this, status); // this is dummy non-void marker used for set semantics
                if (U_FAILURE(status)) {
                    break;
                }
            }
        }
    }
}